

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_set_info_key(qpdf_data qpdf,char *key,char *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  bool bVar1;
  size_t sVar2;
  QPDFObjectHandle *oh;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138 [32];
  undefined1 local_118 [8];
  QPDFObjectHandle info;
  QPDFObjectHandle local_f8;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  QPDFObjectHandle trailer;
  allocator<char> local_71;
  string local_70;
  QPDFObjectHandle local_50 [2];
  undefined1 local_30 [8];
  QPDFObjectHandle value_object;
  char *value_local;
  char *key_local;
  qpdf_data qpdf_local;
  
  if (((key != (char *)0x0) &&
      (value_object.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value,
      sVar2 = strlen(key), sVar2 != 0)) && (*key == '/')) {
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_30);
    if (value_object.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      QTC::TC("qpdf","qpdf-c set_info_key to null",0);
      QPDFObjectHandle::newNull();
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)local_30,
                 (QPDFObjectHandle *)
                 &trailer.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &trailer.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      QTC::TC("qpdf","qpdf-c set_info_key to value",0);
      __s = value_object.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,(char *)__s._M_pi,&local_71);
      QPDFObjectHandle::newString(local_50,&local_70);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)local_30,local_50);
      QPDFObjectHandle::~QPDFObjectHandle(local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)qpdf);
    QPDF::getTrailer((QPDF *)local_98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/Info",&local_b9);
    bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      QTC::TC("qpdf","qpdf-c set-info-key use existing info",0);
    }
    else {
      QTC::TC("qpdf","qpdf-c add info to trailer",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"/Info",&local_e1);
      oh = (QPDFObjectHandle *)
           std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)qpdf);
      QPDFObjectHandle::newDictionary();
      QPDF::makeIndirectObject((QPDF *)&local_f8,oh);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_98,&local_e0,&local_f8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &info.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_138,"/Info",&local_139);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_118,(string *)local_98);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator(&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,key,&local_161);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_118,&local_160,(QPDFObjectHandle *)local_30);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_98);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  }
  return;
}

Assistant:

void
qpdf_set_info_key(qpdf_data qpdf, char const* key, char const* value)
{
    if ((key == nullptr) || (std::strlen(key) == 0) || (key[0] != '/')) {
        return;
    }
    QPDFObjectHandle value_object;
    if (value) {
        QTC::TC("qpdf", "qpdf-c set_info_key to value");
        value_object = QPDFObjectHandle::newString(value);
    } else {
        QTC::TC("qpdf", "qpdf-c set_info_key to null");
        value_object = QPDFObjectHandle::newNull();
    }

    QPDFObjectHandle trailer = qpdf->qpdf->getTrailer();
    if (!trailer.hasKey("/Info")) {
        QTC::TC("qpdf", "qpdf-c add info to trailer");
        trailer.replaceKey(
            "/Info", qpdf->qpdf->makeIndirectObject(QPDFObjectHandle::newDictionary()));
    } else {
        QTC::TC("qpdf", "qpdf-c set-info-key use existing info");
    }

    QPDFObjectHandle info = trailer.getKey("/Info");
    info.replaceKey(key, value_object);
}